

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> * __thiscall
Cipher::Processor::getClusterings
          (vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *__return_storage_ptr__,
          Processor *this,int nClusterings)

{
  float fVar1;
  int iVar2;
  pointer piVar3;
  pointer pTVar4;
  pointer pTVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  int iVar12;
  TClusters *__x;
  long lVar13;
  long lVar14;
  TSimilarityMap *pTVar15;
  pointer pvVar16;
  __normal_iterator<Cipher::TResult_*,_std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>_>
  __i;
  ulong uVar17;
  pointer pTVar18;
  uint uVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  int local_c4;
  double local_b0;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> all;
  TClusters clustersNew;
  
  __x = &(this->m_curResult).clusters;
  std::vector<int,_std::allocator<int>_>::vector(&clustersNew,__x);
  uVar17 = (long)clustersNew.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)clustersNew.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back(&all,&this->m_curResult)
  ;
  uVar17 = uVar17 >> 2;
  local_b0 = (double)(this->m_params).temp0;
  fVar1 = (this->m_params).coolingRate;
  iVar12 = (int)uVar17;
  dVar6 = (double)((iVar12 + -1) * iVar12) * 0.5;
  uVar19 = 0;
  uVar11 = 0;
  if (0 < iVar12) {
    uVar11 = uVar17 & 0xffffffff;
  }
  local_c4 = 0;
  do {
    std::vector<int,_std::allocator<int>_>::operator=(&clustersNew,__x);
    iVar7 = rand();
    iVar9 = (int)((long)iVar7 % (long)iVar12);
    iVar2 = clustersNew.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9];
    do {
      iVar8 = rand();
      iVar8 = iVar8 % ((this->m_params).maxClusters + -1) + 1;
      clustersNew.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9] = iVar8;
    } while (iVar8 == iVar2);
    dVar23 = this->m_pCur;
    dVar24 = dVar6 * dVar23;
    piVar3 = (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = 0; uVar11 * 4 != lVar14; lVar14 = lVar14 + 4) {
      if (((long)iVar7 % (long)iVar12 & 0xffffffffU) << 2 != lVar14) {
        pTVar15 = &this->m_logMapInv;
        if (*(int *)((long)piVar3 + lVar14) == piVar3[iVar9]) {
          pTVar15 = &this->m_logMap;
        }
        pvVar16 = (this->m_logMapInv).
                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)clustersNew.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar14) == iVar8) {
          pvVar16 = (this->m_logMap).
                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        dVar24 = (dVar24 - *(double *)
                            (*(long *)&(pTVar15->
                                       super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[iVar9].
                                       super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl
                                       .super__Vector_impl_data + lVar14 * 4)) +
                 *(double *)
                  (*(long *)&pvVar16[iVar9].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                             _M_impl.super__Vector_impl_data + lVar14 * 4);
      }
    }
    dVar24 = dVar24 / dVar6;
    if (dVar23 <= dVar24) {
      std::vector<int,_std::allocator<int>_>::operator=(__x,&clustersNew);
LAB_0014ca6d:
      (this->m_curResult).pClusters = dVar24;
      this->m_pCur = dVar24;
    }
    else {
      dVar23 = exp((dVar24 - dVar23) / local_b0);
      fVar20 = frand();
      if ((double)fVar20 < dVar23) {
        std::vector<int,_std::allocator<int>_>::operator=(__x,&clustersNew);
        goto LAB_0014ca6d;
      }
      dVar24 = this->m_pCur;
    }
    if (dVar24 < all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].pClusters ||
        dVar24 == all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].pClusters) {
      local_c4 = local_c4 + 1;
    }
    else {
      local_c4 = 0;
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
                (&all,&this->m_curResult);
    }
    uVar19 = uVar19 + 1;
    if ((uVar19 % 1000 == 0) && (local_b0 = local_b0 * (double)fVar1, local_b0 < 1e-06)) {
      local_b0 = 1e-06;
    }
  } while ((local_c4 < 0x3e9) || (2e-06 <= local_b0));
  dVar6 = all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].pClusters;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (__return_storage_ptr__,
             all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  iVar12 = 1;
  while( true ) {
    pTVar4 = (__return_storage_ptr__->
             super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar5 = (__return_storage_ptr__->
             super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (nClusterings <= iVar12) break;
    lVar14 = ((long)all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0x58;
    uVar11 = ((long)pTVar5 - (long)pTVar4) / 0x58;
    uVar17 = uVar11 & 0xffffffff;
    if ((int)uVar11 < 1) {
      uVar17 = 0;
    }
    uVar11 = 0xffffffff;
    uVar21 = 0;
    uVar22 = 0xbff00000;
    for (uVar10 = (ulong)(int)((ulong)(lVar14 * 5) / 6); (long)uVar10 < (long)(int)lVar14;
        uVar10 = uVar10 + 1) {
      if (dVar6 * 1.1 <=
          all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].pClusters) {
        dVar23 = 1.79769313486232e+308;
        for (lVar13 = 0; uVar17 * 0x58 - lVar13 != 0; lVar13 = lVar13 + 0x58) {
          dVar24 = ABS(all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].pClusters -
                       *(double *)((long)&pTVar4->pClusters + lVar13));
          if (dVar23 <= dVar24) {
            dVar24 = dVar23;
          }
          dVar23 = dVar24;
        }
        if ((double)CONCAT44(uVar22,uVar21) <= dVar23 && dVar23 != (double)CONCAT44(uVar22,uVar21))
        {
          uVar11 = uVar10 & 0xffffffff;
        }
        if (dVar23 <= (double)CONCAT44(uVar22,uVar21)) {
          dVar23 = (double)CONCAT44(uVar22,uVar21);
        }
        uVar21 = SUB84(dVar23,0);
        uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
      }
    }
    if (((double)CONCAT44(uVar22,uVar21) <= 0.005 && (double)CONCAT44(uVar22,uVar21) != 0.005) ||
       ((int)uVar11 == -1)) break;
    std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
              (__return_storage_ptr__,
               all.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
               super__Vector_impl_data._M_start + (int)uVar11);
    iVar12 = iVar12 + 1;
  }
  if (pTVar4 != pTVar5) {
    uVar11 = ((long)pTVar5 - (long)pTVar4) / 0x58;
    lVar14 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
              (pTVar4,pTVar5,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar5 - (long)pTVar4 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar4,pTVar5);
    }
    else {
      pTVar18 = pTVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar4,pTVar18);
      for (; pTVar18 != pTVar5; pTVar18 = pTVar18 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Val_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                  (pTVar18);
      }
    }
  }
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(&all);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&clustersNew.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TResult> Processor::getClusterings(int nClusterings) {
        const auto p0 = m_curResult.pClusters;
        //printf("    [getClusterings] p0 = %g\n", p0);

        int nNoImprovement = 0;
        int nTotalIterations = 0;
        auto clustersNew = m_curResult.clusters;
        const int n = clustersNew.size();

        std::vector<TResult> all;
        all.push_back(m_curResult);

        // simulated annealing
        double T = m_params.temp0;
        const double TMin = 0.000001;
        const double alpha = m_params.coolingRate;
        const double pScale = ((n*(n-1))/2.0);

        while (true) {
            clustersNew = m_curResult.clusters;

            // mutate
            int idxChanged = -1;
            {
                idxChanged = rand()%n;

                auto old = clustersNew[idxChanged];
                do {
                    clustersNew[idxChanged] = 1 + rand()%(m_params.maxClusters - 1);
                } while (clustersNew[idxChanged] == old);
            }

            // compute pNew
            auto pNew = m_pCur*pScale;
            {
                const int j = idxChanged;
                for (int i = 0; i < n; ++i) {
                    if (i == j) {
                        continue;
                    }

                    if (m_curResult.clusters[i] == m_curResult.clusters[j]) {
                        pNew -= m_logMap[j][i].cc;
                    } else {
                        pNew -= m_logMapInv[j][i].cc;
                    }

                    if (clustersNew[i] == clustersNew[j]) {
                        pNew += m_logMap[j][i].cc;
                    } else {
                        pNew += m_logMapInv[j][i].cc;
                    }
                }

                pNew /= pScale;
            }

            // check if we should accept the new value
            if (pNew >= m_pCur) {
                m_curResult.clusters = clustersNew;
                m_curResult.pClusters = pNew;
                m_pCur = pNew;
            } else {
                // accept with probability
                const auto pAccept = std::exp((pNew - m_pCur)/T);
                if (pAccept > frand()) {
                    //printf("    [getClusterings] N = %5d, T = %8.8f, pNew = %g, pCur = %g, pAccept = %g\n", nNoImprovement, T, pNew, m_pCur, pAccept);
                    m_curResult.clusters = clustersNew;
                    m_curResult.pClusters = pNew;
                    m_pCur = pNew;
                }
            }

            // check if we should stop
            if (m_pCur > all.back().pClusters) {
                all.push_back(m_curResult);
                nNoImprovement = 0;
            } else {
                nNoImprovement += 1;
            }

            // update temperature
            nTotalIterations++;
            if (nTotalIterations % 1000 == 0) {
                T = T * alpha;
                if (T < TMin) {
                    T = TMin;
                }
                //printf("    [getClusterings] T = %g\n", T);
            }

            if (nNoImprovement > 1000 && T < 2*TMin) {
                break;
            }
        }

        //printf("    [getClusterings] nTotalIterations = %d\n", nTotalIterations);
        //printf("    [getClusterings] pFinal = %g\n", m_curResult.pClusters);

        const auto pClustersBest = all.back().pClusters;

        std::vector<TResult> result;
        {
            result.push_back(all.back());

            for (int i = 1; i < nClusterings; ++i) {
                int jBest = -1;
                double pDiffMax = -1.0;
                for (int j = 5*all.size()/6; j < (int) all.size(); ++j) {
                    if (all[j].pClusters < 1.1*pClustersBest) {
                        continue;
                    }
                    double pDiffMin = std::numeric_limits<double>::max();
                    for (int k = 0; k < (int) result.size(); ++k) {
                        double pDiff = std::fabs(all[j].pClusters - result[k].pClusters);
                        if (pDiffMin > pDiff) {
                            pDiffMin = pDiff;
                        }
                    }
                    if (pDiffMax < pDiffMin) {
                        pDiffMax = pDiffMin;
                        jBest = j;
                    }
                }

                if (pDiffMax < 0.005 || jBest == -1) {
                    break;
                }

                result.push_back(all[jBest]);
            }
        }

        std::sort(result.begin(), result.end(), [](const TResult & a, const TResult & b) {
            return a.pClusters > b.pClusters;
        });

        return result;
    }